

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O0

bool __thiscall
FSChaCha20Poly1305::Decrypt
          (FSChaCha20Poly1305 *this,Span<const_std::byte> cipher,Span<const_std::byte> aad,
          Span<std::byte> plain1,Span<std::byte> plain2)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  FSChaCha20Poly1305 *in_stack_00000010;
  undefined1 in_stack_00000030 [16];
  Span<const_std::byte> in_stack_00000040;
  bool ret;
  undefined1 in_stack_00000070 [16];
  undefined1 in_stack_00000080 [16];
  Span<std::byte> in_stack_00000090;
  unsigned_long *in_stack_ffffffffffffff18;
  uint *in_stack_ffffffffffffff20;
  pair<unsigned_int,_unsigned_long> *in_stack_ffffffffffffff28;
  AEADChaCha20Poly1305 *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int_&,_unsigned_long_&,_true>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar2 = AEADChaCha20Poly1305::Decrypt
                    (in_stack_ffffffffffffffb0,in_stack_00000040,
                     (Span<const_std::byte>)in_stack_00000030,(Nonce96)in_stack_00000070,
                     (Span<std::byte>)in_stack_00000080,in_stack_00000090);
  NextPacket(in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FSChaCha20Poly1305::Decrypt(Span<const std::byte> cipher, Span<const std::byte> aad, Span<std::byte> plain1, Span<std::byte> plain2) noexcept
{
    bool ret = m_aead.Decrypt(cipher, aad, {m_packet_counter, m_rekey_counter}, plain1, plain2);
    NextPacket();
    return ret;
}